

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall
print_fileinfo::perform(print_fileinfo *this,filesystemcollection *fslist,readercollection *rdlist)

{
  undefined8 *puVar1;
  FileContainer_ptr fs;
  long *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  filesystemcollection::getbyname((filesystemcollection *)&local_20,(string *)fslist);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 0x30))(local_20,&this->_romname);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "dump: invalid fsname";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        FileContainer_ptr fs= fslist.getbyname(_fsname);
        if (!fs) throw "dump: invalid fsname";

        fs->printfileinfo(_romname);
    }